

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Vec3i __thiscall embree::XMLLoader::load<embree::Vec3<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  runtime_error *this_00;
  long *in_RDX;
  int *in_RDI;
  Vec3i VVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Token *in_stack_ffffffffffffff70;
  string local_80 [32];
  long *local_60;
  long *local_48;
  long *local_40;
  ParseLocation *in_stack_ffffffffffffffc8;
  
  local_60 = in_RDX;
  sVar4 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*in_RDX + 0x98));
  if (sVar4 != 3) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*local_60;
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffffc8);
    std::operator+(__lhs,(char *)this_00);
    std::runtime_error::runtime_error(this_00,local_80);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_60 + 0x98),0);
  iVar1 = Token::Int(in_stack_ffffffffffffff70);
  local_40 = local_60;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_60 + 0x98),1);
  iVar2 = Token::Int(in_stack_ffffffffffffff70);
  local_48 = local_60;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_60 + 0x98),2);
  iVar3 = Token::Int(in_stack_ffffffffffffff70);
  *in_RDI = iVar1;
  in_RDI[1] = iVar2;
  in_RDI[2] = iVar3;
  VVar5.field_0.field_0.z = iVar3;
  VVar5.field_0._0_8_ = in_RDI;
  return (Vec3i)VVar5.field_0;
}

Assistant:

Vec3i XMLLoader::load<Vec3i>(const Ref<XML>& xml) {
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int3 body");
    return Vec3i(xml->body[0].Int(),xml->body[1].Int(),xml->body[2].Int());
  }